

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_integrate_pdf<trng::chi_square_dist<long_double>>
               (chi_square_dist<long_double> *d)

{
  undefined1 x [16];
  longdouble *extraout_RDX;
  longdouble *extraout_RDX_00;
  longdouble *extraout_RDX_01;
  __normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_> last;
  int iVar1;
  chi_square_dist<long_double> *in_RSI;
  chi_square_dist<long_double> *__return_storage_ptr__;
  int iVar2;
  long lVar3;
  longdouble lVar4;
  longdouble in_ST1;
  longdouble lVar5;
  longdouble in_ST2;
  longdouble lVar6;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble lVar7;
  longdouble in_ST5;
  longdouble lVar8;
  longdouble in_ST6;
  vector<long_double,_std::allocator<long_double>_> y;
  AssertionHandler catchAssertionHandler;
  undefined6 in_stack_fffffffffffffea2;
  vector<long_double,_std::allocator<long_double>_> local_118;
  long local_100;
  longdouble local_f4;
  longdouble local_e8;
  longdouble local_d8;
  AssertionHandler local_c8;
  SourceLineInfo local_78;
  ITransientExpression local_68;
  longdouble *local_58;
  char *local_50;
  size_t sStack_48;
  longdouble *local_40;
  StringRef local_38;
  
  __return_storage_ptr__ = d;
  sqrtl();
  lVar6 = in_ST6;
  roundl();
  local_100 = (long)ROUND(in_ST1);
  lVar3 = 0x100000;
  if (local_100 < 0x100000) {
    lVar3 = local_100;
  }
  lVar4 = lVar6;
  trng::math::detail::inv_GammaP<long_double>
            ((longdouble *)__return_storage_ptr__,(longdouble)0.5 * (longdouble)(d->P).nu_,
             _DAT_002a96d0);
  trng::math::detail::inv_GammaP<long_double>
            ((longdouble *)__return_storage_ptr__,(longdouble)0.5 * (longdouble)(d->P).nu_,
             _DAT_002a96e0);
  iVar2 = (int)lVar3;
  local_f4 = (longdouble)iVar2;
  lVar5 = ((in_ST3 + in_ST3) - (in_ST2 + in_ST2)) / local_f4;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  last._M_current = extraout_RDX;
  if (-1 < iVar2) {
    iVar1 = 0;
    lVar7 = lVar4;
    do {
      x._10_6_ = in_stack_fffffffffffffea2;
      x._0_10_ = in_ST2 + in_ST2 + lVar5 * (longdouble)iVar1;
      lVar8 = lVar7;
      trng::chi_square_dist<long_double>::pdf
                ((result_type_conflict3 *)d,in_RSI,(result_type_conflict3)x);
      if (local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        in_RSI = (chi_square_dist<long_double> *)
                 local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(longdouble *)&local_c8);
        last._M_current = extraout_RDX_01;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar6;
        lVar6 = lVar4;
        lVar4 = lVar7;
        lVar7 = lVar8;
      }
      else {
        *local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
         super__Vector_impl_data._M_finish = in_ST4;
        in_RSI = (chi_square_dist<long_double> *)
                 (local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                  super__Vector_impl_data._M_finish + 1);
        last._M_current = extraout_RDX_00;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = lVar6;
        lVar6 = lVar4;
        lVar4 = lVar7;
        lVar7 = lVar8;
        local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)in_RSI;
      }
      iVar1 = iVar1 + 1;
    } while (iVar2 + 1 != iVar1);
  }
  simpson_int<__gnu_cxx::__normal_iterator<long_double*,std::vector<long_double,std::allocator<long_double>>>>
            ((value_type *)
             local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_double_*,_std::vector<long_double,_std::allocator<long_double>_>_>
              )local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
               super__Vector_impl_data._M_finish,last);
  local_e8 = ((longdouble)64.0 / local_f4) / local_f4;
  local_68._vptr_ITransientExpression = (_func_int **)0x2a8487;
  local_68.m_isBinaryExpression = true;
  local_68.m_result = false;
  local_68._10_6_ = 0;
  local_78.file =
       "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
  ;
  local_78.line = 0x94;
  Catch::StringRef::StringRef(&local_38,"std::abs(s - result_type(98) / result_type(100)) < tol");
  Catch::AssertionHandler::AssertionHandler
            (&local_c8,(StringRef *)&local_68,&local_78,local_38,Normal);
  lVar6 = local_e8;
  lVar4 = ABS(_DAT_002a96f0 + in_ST4 * lVar5);
  local_d8 = lVar4;
  Catch::StringRef::StringRef((StringRef *)&local_78,"<");
  local_68.m_result = lVar4 < lVar6;
  local_68.m_isBinaryExpression = true;
  local_68._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0031a338;
  local_58 = &local_d8;
  local_50 = local_78.file;
  sStack_48 = local_78.line;
  local_40 = &local_e8;
  Catch::AssertionHandler::handleExpr(&local_c8,&local_68);
  Catch::ITransientExpression::~ITransientExpression(&local_68);
  Catch::AssertionHandler::complete(&local_c8);
  if (local_c8.m_completed == false) {
    (*(local_c8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  if ((value_type *)
      local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_start != (value_type *)0x0) {
    operator_delete(local_118.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void continuous_dist_test_integrate_pdf(const dist &d) {
  using result_type = typename dist::result_type;
  const int samples(static_cast<int>(std::min(
      1024ll * 1024, static_cast<long long>(std::round(
                         1 / std::sqrt(std::numeric_limits<result_type>::epsilon()))))));
  const result_type x_min{d.icdf(result_type(1) / result_type(100))};
  const result_type x_max{d.icdf(result_type(99) / result_type(100))};
  const result_type dx{(x_max - x_min) / samples};
  std::vector<result_type> y;
  for (int i{0}; i <= samples; ++i)
    y.push_back(d.pdf(x_min + i * dx));
  const result_type s{simpson_int(y.begin(), y.end()) * dx};
  const result_type tol{result_type(64) / result_type(samples) / result_type(samples)};
  REQUIRE(std::abs(s - result_type(98) / result_type(100)) < tol);
}